

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O3

void __thiscall
HighsCliqueTable::bronKerboschRecurse
          (HighsCliqueTable *this,BronKerboschData *data,HighsInt Plen,CliqueVar *X,HighsInt Xlen)

{
  pointer *ppCVar1;
  int64_t *piVar2;
  int iVar3;
  iterator __position;
  iterator __position_00;
  pointer pCVar4;
  pointer pCVar5;
  HighsCliqueTable *this_00;
  int iVar6;
  CliqueVar CVar7;
  HighsInt HVar8;
  HighsInt Xlen_00;
  long lVar9;
  CliqueVar *pCVar10;
  vector<int,std::allocator<int>> *neighbourhoodInds;
  int *piVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  pointer pCVar17;
  int *piVar18;
  int iVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  CliqueVar v;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> PminusNu;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> localX;
  CliqueVar local_a0;
  int local_9c;
  double local_98;
  vector<int,std::allocator<int>> *local_90;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> local_88;
  CliqueVar *local_70;
  int *local_68;
  HighsInt local_5c;
  CliqueVar *local_58;
  iterator iStack_50;
  CliqueVar *local_48;
  HighsCliqueTable *local_40;
  int64_t *local_38;
  
  local_98 = data->wR;
  if (Plen != 0) {
    uVar13 = 0;
    do {
      CVar7 = (data->P).
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar13];
      if ((int)CVar7 < 0) {
        dVar20 = (data->sol->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[(uint)CVar7 & 0x7fffffff];
      }
      else {
        dVar20 = 1.0 - (data->sol->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[(uint)CVar7];
      }
      local_98 = local_98 + dVar20;
      uVar13 = uVar13 + 1;
    } while ((uint)Plen != uVar13);
  }
  dVar20 = data->feastol;
  if (data->minW - dVar20 <= local_98) {
    local_9c = Plen;
    if (Xlen == 0 && Plen == 0) {
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::vector
                (&local_88,&data->R);
      dVar20 = local_98 - data->feastol;
      if (data->minW <= dVar20 && dVar20 != data->minW) {
        data->maxcliques =
             data->maxcliques +
             (int)((ulong)((long)(data->cliques).
                                 super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(data->cliques).
                                super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x55555555;
        std::
        vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
        ::clear(&data->cliques);
        data->minW = local_98;
      }
      std::
      vector<std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>,std::allocator<std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>>
      ::
      emplace_back<std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
                ((vector<std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>,std::allocator<std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>>
                  *)&data->cliques,&local_88);
    }
    else {
      iVar6 = data->ncalls + 1;
      data->ncalls = iVar6;
      if (data->maxcalls == iVar6) {
        return;
      }
      if (data->maxcliques ==
          (int)((ulong)((long)(data->cliques).
                              super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(data->cliques).
                             super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
        return;
      }
      if (data->maxNeighbourhoodQueries < data->numNeighbourhoodQueries) {
        return;
      }
      if (Xlen == 0) {
        dVar21 = -1.0;
        uVar13 = 0;
      }
      else {
        uVar14 = 0;
        uVar15 = 0;
        dVar22 = -1.0;
        do {
          CVar7 = X[uVar14];
          uVar13 = (ulong)(uint)CVar7;
          if ((int)CVar7 < 0) {
            dVar21 = (data->sol->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[(uint)CVar7 & 0x7fffffff];
          }
          else {
            dVar21 = 1.0 - (data->sol->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[uVar13];
          }
        } while (((dVar21 <= dVar22) ||
                 (uVar15 = (ulong)(uint)CVar7, dVar22 = dVar21, dVar21 < 1.0 - dVar20)) &&
                (dVar21 = dVar22, uVar13 = uVar15, uVar14 = uVar14 + 1, uVar15 = uVar13,
                dVar22 = dVar21, (uint)Xlen != uVar14));
      }
      CVar7 = SUB84(uVar13,0);
      if (dVar21 < 1.0 - dVar20 && Plen != 0) {
        uVar15 = 0;
        do {
          CVar7 = (data->P).
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar15];
          if ((int)CVar7 < 0) {
            dVar22 = (data->sol->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[(uint)CVar7 & 0x7fffffff];
          }
          else {
            dVar22 = 1.0 - (data->sol->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[(uint)CVar7];
          }
          if ((dVar21 < dVar22) &&
             (uVar13 = (ulong)(uint)CVar7, dVar21 = dVar22, 1.0 - dVar20 <= dVar22)) break;
          CVar7 = SUB84(uVar13,0);
          uVar15 = uVar15 + 1;
        } while ((uint)Plen != uVar15);
      }
      local_88.
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_start = (CliqueVar *)0x0;
      local_88.
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_finish = (CliqueVar *)0x0;
      local_88.
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (CliqueVar *)0x0;
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
      reserve(&local_88,(long)Plen);
      piVar2 = &data->numNeighbourhoodQueries;
      local_90 = (vector<int,std::allocator<int>> *)&data->neighbourhoodInds;
      queryNeighbourhood(this,(vector<int,_std::allocator<int>_> *)local_90,piVar2,CVar7,
                         (data->P).
                         super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                         ._M_impl.super__Vector_impl_data._M_start,local_9c);
      __position._M_current =
           (data->neighbourhoodInds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_70 = X;
      local_5c = Xlen;
      local_40 = this;
      local_38 = piVar2;
      if (__position._M_current ==
          (data->neighbourhoodInds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_90,__position,&local_9c);
        piVar11 = (data->neighbourhoodInds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      else {
        *__position._M_current = local_9c;
        piVar11 = __position._M_current + 1;
        (data->neighbourhoodInds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar11;
      }
      piVar18 = *(int **)local_90;
      if (piVar18 != piVar11) {
        iVar6 = 0;
        local_68 = piVar11;
        do {
          iVar3 = *piVar18;
          iVar19 = iVar3 - iVar6;
          if (iVar19 != 0 && iVar6 <= iVar3) {
            lVar16 = (long)iVar6 << 2;
            do {
              pCVar10 = (CliqueVar *)
                        (&((data->P).
                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + lVar16);
              if (local_88.
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_88.
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                ::_M_realloc_insert<HighsCliqueTable::CliqueVar_const&>
                          ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                            *)&local_88,
                           (iterator)
                           local_88.
                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           ._M_impl.super__Vector_impl_data._M_finish,pCVar10);
              }
              else {
                *local_88.
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 ._M_impl.super__Vector_impl_data._M_finish = *pCVar10;
                local_88.
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_88.
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
              lVar16 = lVar16 + 4;
              iVar19 = iVar19 + -1;
              piVar11 = local_68;
              iVar6 = iVar3;
            } while (iVar19 != 0);
          }
          iVar6 = iVar6 + 1;
          piVar18 = piVar18 + 1;
        } while (piVar18 != piVar11);
      }
      this_00 = local_40;
      HVar8 = local_5c;
      pCVar10 = local_70;
      if (local_88.
          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_88.
          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar13 = (long)local_88.
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_88.
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 2;
        iVar6 = 0;
        if (1 < uVar13) {
          iVar6 = 0;
          do {
            uVar13 = (long)uVar13 >> 1;
            iVar6 = iVar6 + 1;
          } while (1 < uVar13);
        }
        pdqsort_detail::
        pdqsort_loop<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0,false>
                  ((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    )local_88.
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    )local_88.
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(anon_class_8_1_898a9ca8)data,iVar6,
                   true);
      }
      local_58 = (CliqueVar *)0x0;
      iStack_50._M_current = (CliqueVar *)0x0;
      local_48 = (CliqueVar *)0x0;
      std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
      _M_range_insert<HighsCliqueTable::CliqueVar_const*>
                ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>> *)
                 &local_58,0,pCVar10,pCVar10 + HVar8);
      pCVar5 = local_88.
               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_88.
          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_88.
          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_70 = (CliqueVar *)&data->R;
        neighbourhoodInds = local_90;
        pCVar17 = local_88.
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          piVar2 = local_38;
          local_a0 = *pCVar17;
          HVar8 = partitionNeighbourhood
                            (this_00,(vector<int,_std::allocator<int>_> *)neighbourhoodInds,local_38
                             ,local_a0,
                             (data->P).
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             ._M_impl.super__Vector_impl_data._M_start,local_9c);
          Xlen_00 = partitionNeighbourhood
                              (this_00,(vector<int,_std::allocator<int>_> *)neighbourhoodInds,piVar2
                               ,local_a0,local_58,
                               (HighsInt)((ulong)((long)iStack_50._M_current - (long)local_58) >> 2)
                              );
          __position_00._M_current =
               (data->R).
               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position_00._M_current ==
              (data->R).
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
            _M_realloc_insert<HighsCliqueTable::CliqueVar_const&>
                      ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                        *)local_70,__position_00,&local_a0);
          }
          else {
            *__position_00._M_current = local_a0;
            ppCVar1 = &(data->R).
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppCVar1 = *ppCVar1 + 1;
          }
          if ((int)local_a0 < 0) {
            local_68 = (int *)(data->sol->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl.super__Vector_impl_data._M_start[(uint)local_a0 & 0x7fffffff];
          }
          else {
            local_68 = (int *)(1.0 - (data->sol->super__Vector_base<double,_std::allocator<double>_>
                                     )._M_impl.super__Vector_impl_data._M_start[(uint)local_a0]);
          }
          data->wR = data->wR + (double)local_68;
          bronKerboschRecurse(this_00,data,HVar8,local_58,Xlen_00);
          neighbourhoodInds = local_90;
          if (((data->maxcalls == data->ncalls) ||
              (data->maxcliques ==
               (int)((ulong)((long)(data->cliques).
                                   super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(data->cliques).
                                  super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555))
             || (data->maxNeighbourhoodQueries < data->numNeighbourhoodQueries)) break;
          ppCVar1 = &(data->R).
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppCVar1 = *ppCVar1 + -1;
          data->wR = data->wR - (double)local_68;
          local_98 = local_98 - (double)local_68;
          if (local_98 < data->minW) break;
          lVar9 = (long)local_9c;
          pCVar4 = (data->P).
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar16 = -1;
          if (local_9c != HVar8) {
            lVar12 = (long)HVar8;
            iVar6 = local_9c - HVar8;
            do {
              lVar16 = lVar12;
              if (pCVar4[lVar12] == local_a0) break;
              lVar12 = lVar12 + 1;
              iVar6 = iVar6 + -1;
              lVar16 = -1;
            } while (iVar6 != 0);
          }
          local_9c = local_9c + -1;
          CVar7 = pCVar4[lVar16];
          pCVar4[lVar16] = pCVar4[lVar9 + -1];
          pCVar4[lVar9 + -1] = CVar7;
          if (iStack_50._M_current == local_48) {
            std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
            _M_realloc_insert<HighsCliqueTable::CliqueVar_const&>
                      ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                        *)&local_58,iStack_50,&local_a0);
          }
          else {
            *iStack_50._M_current = local_a0;
            iStack_50._M_current = iStack_50._M_current + 1;
          }
          pCVar17 = pCVar17 + 1;
        } while (pCVar17 != pCVar5);
      }
      if (local_58 != (CliqueVar *)0x0) {
        operator_delete(local_58);
      }
    }
    if (local_88.
        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
        ._M_impl.super__Vector_impl_data._M_start != (CliqueVar *)0x0) {
      operator_delete(local_88.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void HighsCliqueTable::bronKerboschRecurse(BronKerboschData& data,
                                           HighsInt Plen, const CliqueVar* X,
                                           HighsInt Xlen) const {
  double w = data.wR;

  for (HighsInt i = 0; i != Plen; ++i) w += data.P[i].weight(data.sol);

  if (w < data.minW - data.feastol) return;

  if (Plen == 0 && Xlen == 0) {
    std::vector<CliqueVar> clique = data.R;

    if (data.minW < w - data.feastol) {
      data.maxcliques -= data.cliques.size();
      data.cliques.clear();
      data.minW = w;
    }
    data.cliques.emplace_back(std::move(clique));
    // do not further search for cliques that are violated less than this
    // current clique
    return;
  }

  ++data.ncalls;

  if (data.stop()) return;

  double pivweight = -1.0;
  CliqueVar pivot{0, 0};

  for (HighsInt i = 0; i != Xlen; ++i) {
    if (X[i].weight(data.sol) > pivweight) {
      pivweight = X[i].weight(data.sol);
      pivot = X[i];
      if (pivweight >= 1.0 - data.feastol) break;
    }
  }

  if (pivweight < 1.0 - data.feastol) {
    for (HighsInt i = 0; i != Plen; ++i) {
      if (data.P[i].weight(data.sol) > pivweight) {
        pivweight = data.P[i].weight(data.sol);
        pivot = data.P[i];
        if (pivweight >= 1.0 - data.feastol) break;
      }
    }
  }

  std::vector<CliqueVar> PminusNu;
  PminusNu.reserve(Plen);
  queryNeighbourhood(data.neighbourhoodInds, data.numNeighbourhoodQueries,
                     pivot, data.P.data(), Plen);
  data.neighbourhoodInds.push_back(Plen);
  HighsInt k = 0;
  for (HighsInt i : data.neighbourhoodInds) {
    while (k < i) PminusNu.push_back(data.P[k++]);
    ++k;
  }

  pdqsort(PminusNu.begin(), PminusNu.end(), [&](CliqueVar a, CliqueVar b) {
    return std::make_pair(a.weight(data.sol), a.index()) >
           std::make_pair(b.weight(data.sol), b.index());
  });

  std::vector<CliqueVar> localX;
  localX.insert(localX.end(), X, X + Xlen);

  for (CliqueVar v : PminusNu) {
    HighsInt newPlen = partitionNeighbourhood(data.neighbourhoodInds,
                                              data.numNeighbourhoodQueries, v,
                                              data.P.data(), Plen);
    HighsInt newXlen = partitionNeighbourhood(data.neighbourhoodInds,
                                              data.numNeighbourhoodQueries, v,
                                              localX.data(), localX.size());

    // add v to R, update the weight, and do the recursive call
    data.R.push_back(v);
    double wv = v.weight(data.sol);
    data.wR += wv;
    bronKerboschRecurse(data, newPlen, localX.data(), newXlen);
    if (data.stop()) return;

    // remove v from R restore the weight and continue the loop in this call
    data.R.pop_back();
    data.wR -= wv;

    w -= wv;
    if (w < data.minW) return;
    // find the position of v in the vertices removed from P for the recursive
    // call
    // and also remove it from the set P for this call
    HighsInt vpos = -1;
    for (HighsInt i = newPlen; i != Plen; ++i) {
      if (data.P[i] == v) {
        vpos = i;
        break;
      }
    }

    // do the removal by first swapping it to the end of P and reduce the size
    // of P accordingly
    assert(vpos != -1);

    --Plen;
    std::swap(data.P[vpos], data.P[Plen]);

    localX.push_back(v);
  }
}